

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::anon_unknown_0::RandomGroup::init(RandomGroup *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  RenderContext *pRVar2;
  DrawTest *node;
  long *name;
  int iVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  uint uVar6;
  deUint32 dVar7;
  deBool dVar8;
  int iVar9;
  _Rb_tree_color _Var10;
  _Rb_tree_color _Var11;
  CompatibilityTestType CVar12;
  int extraout_EAX;
  long lVar13;
  uint *puVar14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  int iVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  deUint32 hash;
  DrawTestSpec spec;
  UniformWeightArray<3> indexTypeWeights;
  UniformWeightArray<5> drawMethodWeights;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> insertedHashes;
  UniformWeightArray<7> primitiveWeights;
  UniformWeightArray<11> inputTypeWeights;
  UniformWeightArray<9> usageWeights;
  AttributeSpec attribSpec;
  Random random;
  UniformWeightArray<12> outputTypeWeights;
  _Rb_tree_color local_354;
  undefined1 local_350 [56];
  pointer local_318;
  iterator local_310;
  AttributeSpec *local_308;
  DrawTest *local_300;
  TestNode *local_2f8;
  long local_2f0;
  float local_2e8 [2];
  long *local_2e0;
  long local_2d0 [2];
  TestContext *local_2c0;
  RenderContext *local_2b8;
  ulong local_2b0;
  float local_2a8 [8];
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_288;
  float local_254 [27];
  AttributeSpec local_1e8 [2];
  ios_base local_178 [264];
  deRandom local_70;
  float local_60 [2];
  undefined8 auStack_58 [5];
  long lVar21;
  
  local_254[0] = 1.0;
  local_254[1] = 1.0;
  local_254[2] = 1.0;
  local_254[3] = 1.0;
  local_254[4] = 1.0;
  local_254[5] = 1.0;
  local_254[6] = 1.0;
  lVar13 = 1;
  auVar22 = _DAT_019fcc00;
  do {
    if (SUB164(auVar22 ^ _DAT_019f5ce0,4) == -0x80000000 &&
        SUB164(auVar22 ^ _DAT_019f5ce0,0) < -0x7ffffffb) {
      local_2a8[lVar13 + 2] = 1.0;
      local_2a8[lVar13 + 3] = 1.0;
    }
    lVar21 = auVar22._8_8_;
    auVar22._0_8_ = auVar22._0_8_ + 2;
    auVar22._8_8_ = lVar21 + 2;
    lVar13 = lVar13 + 2;
  } while (lVar13 != 7);
  local_2a8[0] = 1.0;
  local_2a8[1] = 1.0;
  local_2a8[2] = 1.0;
  local_2e8[0] = 1.0;
  local_2e8[1] = 1.0;
  lVar13 = 3;
  auVar23 = _DAT_01a25df0;
  auVar24 = _DAT_019fcc00;
  do {
    if (SUB164(auVar24 ^ _DAT_019f5ce0,4) == -0x80000000 &&
        SUB164(auVar24 ^ _DAT_019f5ce0,0) < -0x7ffffff5) {
      local_254[lVar13 + 4] = 1.0;
      local_254[lVar13 + 5] = 1.0;
    }
    if (SUB164(auVar23 ^ _DAT_019f5ce0,4) == -0x80000000 &&
        SUB164(auVar23 ^ _DAT_019f5ce0,0) < -0x7ffffff5) {
      local_254[lVar13 + 6] = 1.0;
      local_254[lVar13 + 7] = 1.0;
    }
    lVar21 = auVar24._8_8_;
    auVar24._0_8_ = auVar24._0_8_ + 4;
    auVar24._8_8_ = lVar21 + 4;
    lVar21 = auVar23._8_8_;
    auVar23._0_8_ = auVar23._0_8_ + 4;
    auVar23._8_8_ = lVar21 + 4;
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0xf);
  lVar13 = 0;
  do {
    *(undefined8 *)((long)auStack_58 + lVar13 * 4 + -8) = 0x3f8000003f800000;
    *(undefined8 *)((long)auStack_58 + lVar13 * 4) = 0x3f8000003f800000;
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0xc);
  lVar13 = 1;
  auVar20 = _DAT_019fcc00;
  do {
    if (SUB164(auVar20 ^ _DAT_019f5ce0,4) == -0x80000000 &&
        SUB164(auVar20 ^ _DAT_019f5ce0,0) < -0x7ffffff7) {
      local_254[lVar13 + 0x11] = 1.0;
      local_254[lVar13 + 0x12] = 1.0;
    }
    lVar21 = auVar20._8_8_;
    auVar20._0_8_ = auVar20._0_8_ + 2;
    auVar20._8_8_ = lVar21 + 2;
    lVar13 = lVar13 + 2;
  } while (lVar13 != 0xb);
  local_288._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_288._M_impl.super__Rb_tree_header._M_header;
  local_288._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar19 = 0;
  local_288._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_288._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2f0 = 0;
  local_2f8 = (TestNode *)this;
  local_288._M_impl.super__Rb_tree_header._M_header._M_right =
       local_288._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    deRandom_init(&local_70,(int)uVar19 + 0xc551393);
    uVar6 = de::Random::chooseWeighted<int,int_const*,float_const*>
                      ((Random *)&local_70,init::attribCounts,(int *)init::attribWeights,
                       init::attribWeights);
    deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_350);
    local_350._0_4_ = 3;
    local_350._4_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Primitive,deqp::gls::DrawTestSpec::Primitive_const*,float_const*>
                   ((Random *)&local_70,init::primitives,
                    (Primitive *)"N4deqp5gles310Functional12_GLOBAL__N_110FirstGroupE",local_254);
    local_350._8_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_70,init::primitiveCounts,(int *)init::primitiveCountWeights,
                    init::primitiveCountWeights);
    local_350._12_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::DrawMethod,deqp::gls::DrawTestSpec::DrawMethod_const*,float_const*>
                   ((Random *)&local_70,init::drawMethods,init::indexTypes,local_2a8 + 3);
    local_350._16_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::IndexType,deqp::gls::DrawTestSpec::IndexType_const*,float_const*>
                   ((Random *)&local_70,init::indexTypes,init::storages,local_2a8);
    local_350._20_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_70,init::indexOffsets,(int *)init::indexOffsetWeights,
                    init::indexOffsetWeights);
    local_350._24_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Storage,deqp::gls::DrawTestSpec::Storage_const*,float_const*>
                   ((Random *)&local_70,init::storages,(Storage *)&DAT_01c1d168,local_2e8);
    local_350._28_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_70,init::firsts,(int *)init::firstWeights,init::firstWeights);
    local_350._32_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_70,init::indexMins,init::indexMaxs,init::indexWeights);
    local_350._36_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_70,init::indexMaxs,(int *)init::indexWeights,init::indexWeights
                   );
    local_350._40_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_70,init::instanceCounts,(int *)init::instanceWeights,
                    init::instanceWeights);
    bVar5 = deqp::gls::DrawTestSpec::valid((DrawTestSpec *)local_350);
    if (bVar5) {
      local_2b0 = uVar19;
      if (0 < (int)uVar6) {
        iVar18 = 0;
        do {
          deqp::gls::DrawTestSpec::AttributeSpec::AttributeSpec(local_1e8);
          local_1e8[0].inputType =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::InputType,deqp::gls::DrawTestSpec::InputType_const*,float_const*>
                         ((Random *)&local_70,init::inputTypes,(InputType *)&DAT_01c1d19c,
                          local_254 + 7);
          local_1e8[0].outputType =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::OutputType,deqp::gls::DrawTestSpec::OutputType_const*,float_const*>
                         ((Random *)&local_70,init::outputTypes,init::usages,local_60);
          local_1e8[0].storage =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::Storage,deqp::gls::DrawTestSpec::Storage_const*,float_const*>
                         ((Random *)&local_70,init::storages,(Storage *)&DAT_01c1d168,local_2e8);
          local_1e8[0].usage =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::Usage,deqp::gls::DrawTestSpec::Usage_const*,float_const*>
                         ((Random *)&local_70,init::usages,init::blacklistedCases,local_254 + 0x12);
          dVar7 = deRandom_getUint32(&local_70);
          local_1e8[0].componentCount = (dVar7 & 3) + 1;
          local_1e8[0].offset =
               de::Random::chooseWeighted<int,int_const*,float_const*>
                         ((Random *)&local_70,init::offsets,(int *)init::offsetWeights,
                          init::offsetWeights);
          local_1e8[0].stride =
               de::Random::chooseWeighted<int,int_const*,float_const*>
                         ((Random *)&local_70,init::strides,(int *)init::strideWeights,
                          init::strideWeights);
          dVar8 = deRandom_getBool(&local_70);
          local_1e8[0].normalize = dVar8 == 1;
          local_1e8[0].instanceDivisor =
               de::Random::chooseWeighted<int,int_const*,float_const*>
                         ((Random *)&local_70,init::instanceDivisors,
                          (int *)init::instanceDivisorWeights,init::instanceDivisorWeights);
          dVar8 = deRandom_getBool(&local_70);
          local_1e8[0].useDefaultAttribute = dVar8 == 1;
          bVar5 = deqp::gls::DrawTestSpec::AttributeSpec::valid(local_1e8,(ApiType)local_350._0_4_);
          iVar3 = local_1e8[0].componentCount;
          if (local_1e8[0].stride == 0) {
            if (bVar5) goto LAB_01268a87;
          }
          else {
            iVar9 = deqp::gls::DrawTestSpec::inputTypeSize(local_1e8[0].inputType);
            if (bVar5 && iVar9 * iVar3 <= local_1e8[0].stride) {
LAB_01268a87:
              if (local_310._M_current == local_308) {
                std::
                vector<deqp::gls::DrawTestSpec::AttributeSpec,std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>>
                ::_M_realloc_insert<deqp::gls::DrawTestSpec::AttributeSpec_const&>
                          ((vector<deqp::gls::DrawTestSpec::AttributeSpec,std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>>
                            *)&local_318,local_310,local_1e8);
              }
              else {
                (local_310._M_current)->instanceDivisor = local_1e8[0].instanceDivisor;
                (local_310._M_current)->useDefaultAttribute = (bool)(char)local_1e8[0]._36_4_;
                (local_310._M_current)->additionalPositionAttribute =
                     (bool)SUB41(local_1e8[0]._36_4_,1);
                (local_310._M_current)->bgraComponentOrder = (bool)SUB41(local_1e8[0]._36_4_,2);
                (local_310._M_current)->field_0x27 = SUB41(local_1e8[0]._36_4_,3);
                (local_310._M_current)->componentCount = local_1e8[0].componentCount;
                (local_310._M_current)->offset = local_1e8[0].offset;
                (local_310._M_current)->stride = local_1e8[0].stride;
                (local_310._M_current)->normalize = (bool)(char)local_1e8[0]._28_4_;
                *(int3 *)&(local_310._M_current)->field_0x1d = SUB43(local_1e8[0]._28_4_,1);
                (local_310._M_current)->inputType = local_1e8[0].inputType;
                (local_310._M_current)->outputType = local_1e8[0].outputType;
                (local_310._M_current)->storage = local_1e8[0].storage;
                (local_310._M_current)->usage = local_1e8[0].usage;
                local_310._M_current = local_310._M_current + 1;
              }
              iVar18 = iVar18 + 1;
            }
          }
        } while (iVar18 < (int)uVar6);
      }
      uVar19 = local_2b0;
      if (local_350._4_4_ != PRIMITIVE_POINTS) {
        local_318->instanceDivisor = 0;
      }
      if (((((local_350._12_4_ != DRAWMETHOD_DRAWELEMENTS_RANGED) ||
            (local_350._4_4_ == PRIMITIVE_POINTS)) || (local_350._32_4_ != local_350._36_4_)) &&
          ((local_350._4_4_ == PRIMITIVE_POINTS || (local_318->useDefaultAttribute == false)))) &&
         ((2 < local_350._4_4_ - PRIMITIVE_TRIANGLES ||
          (((local_318->componentCount != 1 &&
            ((OUTPUTTYPE_UINT < local_318->outputType ||
             ((0x31U >> (local_318->outputType & 0x1f) & 1) == 0)))) &&
           ((local_350._12_4_ != DRAWMETHOD_DRAWELEMENTS_RANGED ||
            (1 < (int)(local_350._36_4_ - local_350._32_4_))))))))) {
        _Var10 = deqp::gls::DrawTestSpec::hash((DrawTestSpec *)local_350);
        if (0 < (int)uVar6) {
          lVar13 = 0;
          do {
            local_354 = _Var10;
            _Var11 = deqp::gls::DrawTestSpec::AttributeSpec::hash
                               ((AttributeSpec *)((long)&local_318->inputType + lVar13));
            _Var10 = _Var10 << 2 ^ _Var11;
            lVar13 = lVar13 + 0x28;
          } while ((ulong)uVar6 * 0x28 != lVar13);
        }
        local_354 = _Var10;
        if (local_288._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var4 = local_288._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var17 = &local_288._M_impl.super__Rb_tree_header._M_header;
          do {
            p_Var16 = p_Var17;
            p_Var15 = p_Var4;
            _Var11 = p_Var15[1]._M_color;
            p_Var17 = p_Var15;
            if (_Var11 < _Var10) {
              p_Var17 = p_Var16;
            }
            p_Var4 = (&p_Var15->_M_left)[_Var11 < _Var10];
          } while ((&p_Var15->_M_left)[_Var11 < _Var10] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var17 != &local_288._M_impl.super__Rb_tree_header) {
            if (_Var11 < _Var10) {
              p_Var15 = p_Var16;
            }
            if (p_Var15[1]._M_color <= _Var10) goto LAB_01268d6e;
          }
        }
        CVar12 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_350);
        if (((CVar12 != COMPATIBILITY_UNALIGNED_OFFSET) &&
            (CVar12 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_350),
            CVar12 != COMPATIBILITY_UNALIGNED_STRIDE)) &&
           (puVar14 = std::
                      __find_if<unsigned_int_const*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                (init::blacklistedCases,&DAT_01c1d1f8,&local_354),
           puVar14 == (uint *)&DAT_01c1d1f8)) {
          local_300 = (DrawTest *)operator_new(0x138);
          pTVar1 = local_2f8->m_testCtx;
          pRVar2 = ((Context *)local_2f8[1]._vptr_TestNode)->m_renderCtx;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          local_2b8 = pRVar2;
          std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
          std::__cxx11::stringbuf::str();
          local_2c0 = pTVar1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base(local_178);
          name = local_2e0;
          deqp::gls::DrawTestSpec::getDesc_abi_cxx11_((string *)local_1e8,(DrawTestSpec *)local_350)
          ;
          node = local_300;
          deqp::gls::DrawTest::DrawTest
                    (local_300,local_2c0,local_2b8,(DrawTestSpec *)local_350,(char *)name,
                     (char *)CONCAT44(local_1e8[0].outputType,local_1e8[0].inputType));
          tcu::TestNode::addChild(local_2f8,(TestNode *)node);
          if ((int *)CONCAT44(local_1e8[0].outputType,local_1e8[0].inputType) !=
              &local_1e8[0].componentCount) {
            operator_delete((undefined1 *)CONCAT44(local_1e8[0].outputType,local_1e8[0].inputType),
                            CONCAT44(local_1e8[0].offset,local_1e8[0].componentCount) + 1);
          }
          if (local_2e0 != local_2d0) {
            operator_delete(local_2e0,local_2d0[0] + 1);
          }
        }
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&local_288,&local_354);
        local_2f0 = local_2f0 + 1;
      }
    }
LAB_01268d6e:
    if (local_318 != (pointer)0x0) {
      operator_delete(local_318,(long)local_308 - (long)local_318);
    }
    uVar6 = (int)uVar19 + 1;
    uVar19 = (ulong)uVar6;
    if (uVar6 == 300) {
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_288);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void RandomGroup::init (void)
{
	const int			numAttempts				= 300;

	static const int	attribCounts[]			= { 1, 2, 5 };
	static const float	attribWeights[]			= { 30, 10, 1 };
	static const int	primitiveCounts[]		= { 1, 5, 64 };
	static const float	primitiveCountWeights[]	= { 20, 10, 1 };
	static const int	indexOffsets[]			= { 0, 7, 13 };
	static const float	indexOffsetWeights[]	= { 20, 20, 1 };
	static const int	firsts[]				= { 0, 7, 13 };
	static const float	firstWeights[]			= { 20, 20, 1 };
	static const int	instanceCounts[]		= { 1, 2, 16, 17 };
	static const float	instanceWeights[]		= { 20, 10, 5, 1 };
	static const int	indexMins[]				= { 0, 1, 3, 8 };
	static const int	indexMaxs[]				= { 4, 8, 128, 257 };
	static const float	indexWeights[]			= { 50, 50, 50, 50 };
	static const int	offsets[]				= { 0, 1, 5, 12 };
	static const float	offsetWeights[]			= { 50, 10, 10, 10 };
	static const int	strides[]				= { 0, 7, 16, 17 };
	static const float	strideWeights[]			= { 50, 10, 10, 10 };
	static const int	instanceDivisors[]		= { 0, 1, 3, 129 };
	static const float	instanceDivisorWeights[]= { 70, 30, 10, 10 };

	static const gls::DrawTestSpec::Primitive primitives[] =
	{
		gls::DrawTestSpec::PRIMITIVE_POINTS,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLES,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINES,
		gls::DrawTestSpec::PRIMITIVE_LINE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINE_LOOP
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(primitives)> primitiveWeights;

	static const gls::DrawTestSpec::DrawMethod drawMethods[] =
	{
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS,
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INSTANCED,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(drawMethods)> drawMethodWeights;

	static const gls::DrawTestSpec::IndexType indexTypes[] =
	{
		gls::DrawTestSpec::INDEXTYPE_BYTE,
		gls::DrawTestSpec::INDEXTYPE_SHORT,
		gls::DrawTestSpec::INDEXTYPE_INT,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(indexTypes)> indexTypeWeights;

	static const gls::DrawTestSpec::Storage storages[] =
	{
		gls::DrawTestSpec::STORAGE_USER,
		gls::DrawTestSpec::STORAGE_BUFFER,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(storages)> storageWeights;

	static const gls::DrawTestSpec::InputType inputTypes[] =
	{
		gls::DrawTestSpec::INPUTTYPE_FLOAT,
		gls::DrawTestSpec::INPUTTYPE_FIXED,
		gls::DrawTestSpec::INPUTTYPE_BYTE,
		gls::DrawTestSpec::INPUTTYPE_SHORT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT,
		gls::DrawTestSpec::INPUTTYPE_INT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT,
		gls::DrawTestSpec::INPUTTYPE_HALF,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10,
		gls::DrawTestSpec::INPUTTYPE_INT_2_10_10_10,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(inputTypes)> inputTypeWeights;

	static const gls::DrawTestSpec::OutputType outputTypes[] =
	{
		gls::DrawTestSpec::OUTPUTTYPE_FLOAT,
		gls::DrawTestSpec::OUTPUTTYPE_VEC2,
		gls::DrawTestSpec::OUTPUTTYPE_VEC3,
		gls::DrawTestSpec::OUTPUTTYPE_VEC4,
		gls::DrawTestSpec::OUTPUTTYPE_INT,
		gls::DrawTestSpec::OUTPUTTYPE_UINT,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC4,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC4,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(outputTypes)> outputTypeWeights;

	static const gls::DrawTestSpec::Usage usages[] =
	{
		gls::DrawTestSpec::USAGE_DYNAMIC_DRAW,
		gls::DrawTestSpec::USAGE_STATIC_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_READ,
		gls::DrawTestSpec::USAGE_STREAM_COPY,
		gls::DrawTestSpec::USAGE_STATIC_READ,
		gls::DrawTestSpec::USAGE_STATIC_COPY,
		gls::DrawTestSpec::USAGE_DYNAMIC_READ,
		gls::DrawTestSpec::USAGE_DYNAMIC_COPY,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(usages)> usageWeights;

	static const deUint32 blacklistedCases[]=
	{
		544,	//!< extremely narrow triangle
	};

	std::set<deUint32>	insertedHashes;
	size_t				insertedCount = 0;

	for (int ndx = 0; ndx < numAttempts; ++ndx)
	{
		de::Random random(0xc551393 + ndx); // random does not depend on previous cases

		int					attributeCount = random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(attribCounts), DE_ARRAY_END(attribCounts), attribWeights);
		gls::DrawTestSpec	spec;

		spec.apiType				= glu::ApiType::es(3,0);
		spec.primitive				= random.chooseWeighted<gls::DrawTestSpec::Primitive>	(DE_ARRAY_BEGIN(primitives),		DE_ARRAY_END(primitives),		primitiveWeights.weights);
		spec.primitiveCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(primitiveCounts),	DE_ARRAY_END(primitiveCounts),	primitiveCountWeights);
		spec.drawMethod				= random.chooseWeighted<gls::DrawTestSpec::DrawMethod>	(DE_ARRAY_BEGIN(drawMethods),		DE_ARRAY_END(drawMethods),		drawMethodWeights.weights);
		spec.indexType				= random.chooseWeighted<gls::DrawTestSpec::IndexType>	(DE_ARRAY_BEGIN(indexTypes),		DE_ARRAY_END(indexTypes),		indexTypeWeights.weights);
		spec.indexPointerOffset		= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexOffsets),		DE_ARRAY_END(indexOffsets),		indexOffsetWeights);
		spec.indexStorage			= random.chooseWeighted<gls::DrawTestSpec::Storage>		(DE_ARRAY_BEGIN(storages),			DE_ARRAY_END(storages),			storageWeights.weights);
		spec.first					= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(firsts),			DE_ARRAY_END(firsts),			firstWeights);
		spec.indexMin				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMins),			DE_ARRAY_END(indexMins),		indexWeights);
		spec.indexMax				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMaxs),			DE_ARRAY_END(indexMaxs),		indexWeights);
		spec.instanceCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(instanceCounts),	DE_ARRAY_END(instanceCounts),	instanceWeights);

		// check spec is legal
		if (!spec.valid())
			continue;

		for (int attrNdx = 0; attrNdx < attributeCount;)
		{
			bool valid;
			gls::DrawTestSpec::AttributeSpec attribSpec;

			attribSpec.inputType			= random.chooseWeighted<gls::DrawTestSpec::InputType>	(DE_ARRAY_BEGIN(inputTypes),		DE_ARRAY_END(inputTypes),		inputTypeWeights.weights);
			attribSpec.outputType			= random.chooseWeighted<gls::DrawTestSpec::OutputType>	(DE_ARRAY_BEGIN(outputTypes),		DE_ARRAY_END(outputTypes),		outputTypeWeights.weights);
			attribSpec.storage				= random.chooseWeighted<gls::DrawTestSpec::Storage>		(DE_ARRAY_BEGIN(storages),			DE_ARRAY_END(storages),			storageWeights.weights);
			attribSpec.usage				= random.chooseWeighted<gls::DrawTestSpec::Usage>		(DE_ARRAY_BEGIN(usages),			DE_ARRAY_END(usages),			usageWeights.weights);
			attribSpec.componentCount		= random.getInt(1, 4);
			attribSpec.offset				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(offsets), DE_ARRAY_END(offsets), offsetWeights);
			attribSpec.stride				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(strides), DE_ARRAY_END(strides), strideWeights);
			attribSpec.normalize			= random.getBool();
			attribSpec.instanceDivisor		= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(instanceDivisors), DE_ARRAY_END(instanceDivisors), instanceDivisorWeights);
			attribSpec.useDefaultAttribute	= random.getBool();

			// check spec is legal
			valid = attribSpec.valid(spec.apiType);

			// we do not want interleaved elements. (Might result in some weird floating point values)
			if (attribSpec.stride && attribSpec.componentCount * gls::DrawTestSpec::inputTypeSize(attribSpec.inputType) > attribSpec.stride)
				valid = false;

			// try again if not valid
			if (valid)
			{
				spec.attribs.push_back(attribSpec);
				++attrNdx;
			}
		}

		// Do not collapse all vertex positions to a single positions
		if (spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
			spec.attribs[0].instanceDivisor = 0;

		// Is render result meaningful?
		{
			// Only one vertex
			if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && spec.indexMin == spec.indexMax && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;
			if (spec.attribs[0].useDefaultAttribute && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;

			// Triangle only on one axis
			if (spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLES || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP)
			{
				if (spec.attribs[0].componentCount == 1)
					continue;
				if (spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_FLOAT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_INT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_UINT)
					continue;
				if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && (spec.indexMax - spec.indexMin) < 2)
					continue;
			}
		}

		// Add case
		{
			deUint32 hash = spec.hash();
			for (int attrNdx = 0; attrNdx < attributeCount; ++attrNdx)
				hash = (hash << 2) ^ (deUint32)spec.attribs[attrNdx].hash();

			if (insertedHashes.find(hash) == insertedHashes.end())
			{
				// Only properly aligned and not blacklisted cases
				if (spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET			&&
					spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE			&&
					!de::contains(DE_ARRAY_BEGIN(blacklistedCases), DE_ARRAY_END(blacklistedCases), hash))
				{
					this->addChild(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), spec, de::toString(insertedCount).c_str(), spec.getDesc().c_str()));
				}
				insertedHashes.insert(hash);

				++insertedCount;
			}
		}
	}
}